

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

size_t mime_subparts_read(char *buffer,size_t size,size_t nitems,void *instream)

{
  mime_state *state;
  curl_mimepart *pcVar1;
  char *__s;
  size_t numbytes;
  size_t sVar2;
  char *trail;
  size_t sVar3;
  size_t local_48;
  
  state = (mime_state *)((long)instream + 0x28);
  sVar3 = 0;
  do {
    if (nitems == 0) {
      return sVar3;
    }
    sVar2 = 0;
    if (8 < *(uint *)((long)instream + 0x28)) goto switchD_004fbef3_caseD_1;
    pcVar1 = *(curl_mimepart **)((long)instream + 0x30);
    switch(*(uint *)((long)instream + 0x28)) {
    case 0:
    case 4:
      *(undefined4 *)((long)instream + 0x28) = 5;
      *(undefined8 *)((long)instream + 0x30) = *(undefined8 *)((long)instream + 0x10);
      *(undefined8 *)((long)instream + 0x38) = 2;
LAB_004fbf0c:
      sVar2 = 0;
      break;
    case 5:
      sVar2 = readback_bytes(state,buffer,nitems,"\r\n--",4,"");
      if (sVar2 == 0) {
        *(undefined4 *)((long)instream + 0x28) = 6;
        *(curl_mimepart **)((long)instream + 0x30) = pcVar1;
LAB_004fc025:
        *(undefined8 *)((long)instream + 0x38) = 0;
        goto LAB_004fbf0c;
      }
      break;
    case 6:
      __s = *(char **)((long)instream + 0x20);
      numbytes = strlen(__s);
      trail = "\r\n";
      if (pcVar1 == (curl_mimepart *)0x0) {
        trail = "--\r\n";
      }
      sVar2 = readback_bytes(state,buffer,nitems,__s,numbytes,trail);
      if (sVar2 == 0) {
        *(undefined4 *)((long)instream + 0x28) = 7;
        *(curl_mimepart **)((long)instream + 0x30) = pcVar1;
        *(undefined8 *)((long)instream + 0x38) = 0;
        sVar2 = 0;
      }
      break;
    case 7:
      if (pcVar1 == (curl_mimepart *)0x0) {
        state->state = MIMESTATE_END;
        *(undefined8 *)((long)instream + 0x30) = 0;
        *(undefined8 *)((long)instream + 0x38) = 0;
        goto LAB_004fbf0c;
      }
      sVar2 = readback_part(pcVar1,buffer,nitems);
      if (1 < sVar2 - 0x10000000) {
        if (sVar2 == 0) {
          pcVar1 = pcVar1->nextpart;
          *(undefined4 *)((long)instream + 0x28) = 5;
          *(curl_mimepart **)((long)instream + 0x30) = pcVar1;
          goto LAB_004fc025;
        }
        if (sVar2 != 0xffffffffffffffff) break;
      }
      local_48 = sVar2;
      if (sVar3 != 0) {
        local_48 = sVar3;
      }
      sVar2 = 0;
      goto LAB_004fbfb5;
    case 8:
      local_48 = sVar3;
      goto LAB_004fbfb5;
    }
switchD_004fbef3_caseD_1:
    sVar3 = sVar3 + sVar2;
    buffer = buffer + sVar2;
    nitems = nitems - sVar2;
    sVar2 = 1;
LAB_004fbfb5:
    if ((char)sVar2 == '\0') {
      return local_48;
    }
  } while( true );
}

Assistant:

static size_t mime_subparts_read(char *buffer, size_t size, size_t nitems,
                                 void *instream)
{
  curl_mime *mime = (curl_mime *) instream;
  size_t cursize = 0;
#ifdef CURL_DOES_CONVERSIONS
  char *convbuf = buffer;
#endif

  (void) size;   /* Always 1. */

  while(nitems) {
    size_t sz = 0;
    curl_mimepart *part = mime->state.ptr;
    switch(mime->state.state) {
    case MIMESTATE_BEGIN:
    case MIMESTATE_BODY:
#ifdef CURL_DOES_CONVERSIONS
      convbuf = buffer;
#endif
      mimesetstate(&mime->state, MIMESTATE_BOUNDARY1, mime->firstpart);
      /* The first boundary always follows the header termination empty line,
         so is always preceded by a CRLK. We can then spare 2 characters
         by skipping the leading CRLF in boundary. */
      mime->state.offset += 2;
      break;
    case MIMESTATE_BOUNDARY1:
      sz = readback_bytes(&mime->state, buffer, nitems, "\r\n--", 4, "");
      if(!sz)
        mimesetstate(&mime->state, MIMESTATE_BOUNDARY2, part);
      break;
    case MIMESTATE_BOUNDARY2:
      sz = readback_bytes(&mime->state, buffer, nitems, mime->boundary,
                          strlen(mime->boundary), part? "\r\n": "--\r\n");
      if(!sz) {
#ifdef CURL_DOES_CONVERSIONS
        if(mime->easy && convbuf < buffer) {
          CURLcode result = Curl_convert_to_network(mime->easy, convbuf,
                                                    buffer - convbuf);
          if(result)
            return READ_ERROR;
          convbuf = buffer;
        }
#endif
        mimesetstate(&mime->state, MIMESTATE_CONTENT, part);
      }
      break;
    case MIMESTATE_CONTENT:
      if(!part) {
        mimesetstate(&mime->state, MIMESTATE_END, NULL);
        break;
      }
      sz = readback_part(part, buffer, nitems);
      switch(sz) {
      case CURL_READFUNC_ABORT:
      case CURL_READFUNC_PAUSE:
      case READ_ERROR:
        return cursize? cursize: sz;
      case 0:
#ifdef CURL_DOES_CONVERSIONS
        convbuf = buffer;
#endif
        mimesetstate(&mime->state, MIMESTATE_BOUNDARY1, part->nextpart);
        break;
      }
      break;
    case MIMESTATE_END:
      return cursize;
    default:
      break;    /* other values not used in mime state. */
    }

    /* Bump buffer and counters according to read size. */
    cursize += sz;
    buffer += sz;
    nitems -= sz;
  }

#ifdef CURL_DOES_CONVERSIONS
      if(mime->easy && convbuf < buffer &&
         mime->state.state <= MIMESTATE_CONTENT) {
        CURLcode result = Curl_convert_to_network(mime->easy, convbuf,
                                                  buffer - convbuf);
        if(result)
          return READ_ERROR;
      }
#endif

  return cursize;
}